

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Abstractions.hpp
# Opt level: O3

bool __thiscall
Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::nextStep
          (Path *this,uint baseDepth)

{
  _Head_base<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_false>
  _Var1;
  TermEntry *pTVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  bVar3 = Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
          get<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1)_1_>
                    ();
  if (bVar3) {
    push(this,0);
    bVar3 = true;
  }
  else {
    Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
    top<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1&)_1_>
              ((Path *)this,0);
    uVar6 = 2;
    if (2 < baseDepth) {
      uVar6 = (ulong)baseDepth;
    }
    while( true ) {
      _Var1._M_head_impl =
           (this->termIdx)._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>,_std::default_delete<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_std::default_delete<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_>_>
           .
           super__Head_base<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_false>
           ._M_head_impl;
      uVar5 = (long)(_Var1._M_head_impl)->_cursor - (long)(_Var1._M_head_impl)->_stack;
      bVar3 = (this->litIdx).
              super_OptionBase<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::LiteralEntry>
              ._isSome;
      uVar4 = ((long)uVar5 >> 4) + (ulong)bVar3 + 1;
      if (uVar4 < uVar6) break;
      bVar3 = Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
              get<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1)_2_>
                        ((Path *)this,(int)(uVar5 >> 4) + (uint)bVar3);
      _Var1._M_head_impl =
           (this->termIdx)._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>,_std::default_delete<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_std::default_delete<Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_>_>
           .
           super__Head_base<0UL,_Lib::Stack<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::TermEntry>_*,_false>
           ._M_head_impl;
      pTVar2 = (_Var1._M_head_impl)->_cursor;
      if (bVar3) {
        uVar4 = ((long)pTVar2 - (long)(_Var1._M_head_impl)->_stack >> 4) +
                (ulong)(this->litIdx).
                       super_OptionBase<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::LiteralEntry>
                       ._isSome + 1;
        break;
      }
      if (pTVar2 == (_Var1._M_head_impl)->_stack) {
        (this->litIdx).
        super_OptionBase<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::LiteralEntry>
        ._isSome = false;
      }
      else {
        (_Var1._M_head_impl)->_cursor = pTVar2 + 0xffffffffffffffff;
      }
      Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
      top<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1&)_2_>
                ((Path *)this,0);
    }
    bVar3 = uVar4 != 1 && baseDepth <= uVar4;
  }
  return bVar3;
}

Assistant:

bool nextStep(unsigned baseDepth) {
      if (top([](auto t){ return t.canPush(); })) {
        push(0);
        return true;
      } else {
        top([](auto& x) { x.idx++; });
        while(depth() > 1 && depth() >= baseDepth && !top([&](auto t) { return t.inBounds(); })) {
          pop();
          top([](auto& x) { x.idx++; });
        }
        if (depth() < baseDepth || depth() == 1) {
          return false;
        } else {
          return true;
        }
      }
    }